

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O1

void __thiscall
solitaire::events::EventsProcessor::tryPullOutCardFromFoundationPile
          (EventsProcessor *this,PileId *id,MouseLeftButtonDown *event,
          FoundationPileCollider *collider)

{
  Context *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*this->context->_vptr_Context[4])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x28))((long *)CONCAT44(extraout_var,iVar2));
  (*this->context->_vptr_Context[2])(this->context,event);
  pCVar1 = this->context;
  (*collider->_vptr_FoundationPileCollider[4])(collider);
  (*pCVar1->_vptr_Context[3])(pCVar1);
  return;
}

Assistant:

void EventsProcessor::tryPullOutCardFromFoundationPile(
    const PileId id, const MouseLeftButtonDown& event,
    const FoundationPileCollider& collider) const
{
    context.getSolitaire().tryPullOutCardFromFoundationPile(id);
    context.setMousePosition(event.position);
    context.setCardsInHandPosition(collider.getPosition());
}